

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<float>_>::SolveJacobi
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL *tol,int FromCurrent)

{
  _ComplexT _Var1;
  long lVar2;
  complex<float> *pcVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  float __x;
  float fVar10;
  undefined4 extraout_XMM0_Da;
  float __x_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar12;
  undefined8 uVar11;
  
  if (FromCurrent == 0) {
    TPZFMatrix<std::complex<float>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  Dot<std::complex<float>>(scratch,scratch);
  if (__x < 0.0) {
    fVar10 = sqrtf(__x);
  }
  else {
    fVar10 = SQRT(__x);
  }
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (0 < *numiterations) {
    lVar2 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar6 = 0;
    do {
      if ((double)ABS(fVar10) < *tol || (double)ABS(fVar10) == *tol) break;
      if (0 < lVar2) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          if (0 < CONCAT44(extraout_var,iVar4)) {
            lVar7 = 0;
            do {
              if (((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar7) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar9
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar5 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
              pcVar3 = scratch->fElem;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar7,lVar7);
              _Var1 = *(_ComplexT *)((long)&pcVar3[lVar7]._M_value + lVar5 * lVar8);
              uVar12 = (undefined4)(_Var1 >> 0x20);
              uVar11 = __divsc3((int)_Var1,CONCAT44(uVar12,uVar12),extraout_XMM0_Da,extraout_XMM0_Db
                               );
              if (((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar7
                  ) || ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                        lVar9)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar5 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                      lVar8;
              _Var1 = *(_ComplexT *)((long)&result->fElem[lVar7]._M_value + lVar5);
              *(_ComplexT *)((long)&result->fElem[lVar7]._M_value + lVar5) =
                   CONCAT44((float)((ulong)uVar11 >> 0x20) + (float)(_Var1 >> 0x20),
                            (float)uVar11 + (float)_Var1);
              lVar7 = lVar7 + 1;
            } while (CONCAT44(extraout_var,iVar4) != lVar7);
          }
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 8;
        } while (lVar9 != lVar2);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
      Dot<std::complex<float>>(scratch,scratch);
      if (__x_00 < 0.0) {
        fVar10 = sqrtf(__x_00);
      }
      else {
        fVar10 = SQRT(__x_00);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *numiterations);
  }
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    TPZFMatrix<std::complex<float>_>::operator=(residual,scratch);
    return;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}